

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall
el::base::TypedConfigurations::build(TypedConfigurations *this,Configurations *configurations)

{
  bool bVar1;
  ConfigurationType CVar2;
  ConfigurationType CVar3;
  string *psVar4;
  reference ppCVar5;
  reference ppCVar6;
  long *in_RSI;
  long *in_RDI;
  iterator conf_2;
  Configuration *conf_1;
  const_iterator it_1;
  Configuration *conf;
  const_iterator it;
  vector<el::Configuration_*,_std::allocator<el::Configuration_*>_> withFileSizeLimit;
  anon_class_1_0_00000001 getBool;
  ScopedLock scopedLock;
  NoMutex *in_stack_fffffffffffffc28;
  undefined4 in_stack_fffffffffffffc30;
  Level in_stack_fffffffffffffc34;
  string *in_stack_fffffffffffffc38;
  Level in_stack_fffffffffffffc40;
  ConfigurationType in_stack_fffffffffffffc44;
  allocator<char> *in_stack_fffffffffffffc48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc50;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffc58;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffc60;
  Level in_stack_fffffffffffffc6c;
  LogFormat *in_stack_fffffffffffffc70;
  ConfigurationType in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc8c;
  string *in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc98;
  ConfigurationType in_stack_fffffffffffffc9c;
  unsigned_long in_stack_fffffffffffffca0;
  string *in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcb0;
  ConfigurationType in_stack_fffffffffffffcb4;
  allocator<char> *in_stack_fffffffffffffcb8;
  TypedConfigurations *in_stack_fffffffffffffcc0;
  string *in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffcd0;
  Level in_stack_fffffffffffffcd4;
  Level in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffce4;
  string *in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcf0;
  Level in_stack_fffffffffffffcf4;
  NoMutex local_2c0 [32];
  Configuration **local_2a0;
  __normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
  local_298;
  Configuration *local_290;
  undefined8 local_288;
  undefined8 local_280;
  __normal_iterator<el::Configuration_*const_*,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
  local_278;
  string local_270 [32];
  char *local_250;
  string local_248 [32];
  LogFormat *local_228;
  string local_220 [39];
  undefined1 local_1f9;
  string local_1f8 [47];
  allocator<char> local_1c9;
  undefined8 local_1c8;
  undefined8 local_1c0;
  string local_1b8 [15];
  undefined1 in_stack_fffffffffffffe57;
  map<el::Level,_el::base::LogFormat,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::LogFormat>_>_>
  *in_stack_fffffffffffffe58;
  LogFormat *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  Level in_stack_fffffffffffffe6c;
  TypedConfigurations *in_stack_fffffffffffffe70;
  string local_e0 [39];
  undefined1 local_b9;
  string local_b8 [39];
  undefined1 local_91;
  string local_90 [39];
  undefined1 local_69;
  Configuration *local_68;
  undefined8 local_60;
  undefined8 local_48;
  __normal_iterator<el::Configuration_*const_*,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
  local_40 [5];
  NoScopedLock<el::base::threading::internal::NoMutex> local_18;
  long *local_10;
  
  local_10 = in_RSI;
  (**(code **)(*in_RDI + 0x10))();
  threading::internal::NoScopedLock<el::base::threading::internal::NoMutex>::NoScopedLock
            ((NoScopedLock<el::base::threading::internal::NoMutex> *)
             CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),in_stack_fffffffffffffc28
            );
  utils::std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>::vector
            ((vector<el::Configuration_*,_std::allocator<el::Configuration_*>_> *)0x26c9fd);
  local_48 = (**(code **)(*local_10 + 0x28))();
  __gnu_cxx::
  __normal_iterator<el::Configuration*const*,std::vector<el::Configuration*,std::allocator<el::Configuration*>>>
  ::__normal_iterator<el::Configuration**>
            ((__normal_iterator<el::Configuration_*const_*,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
              *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
             (__normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
              *)in_stack_fffffffffffffc28);
  while( true ) {
    local_60 = (**(code **)(*local_10 + 0x30))();
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<el::Configuration_*const_*,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                        *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                       (__normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                        *)in_stack_fffffffffffffc28);
    if (!bVar1) break;
    ppCVar5 = __gnu_cxx::
              __normal_iterator<el::Configuration_*const_*,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
              ::operator*(local_40);
    local_68 = *ppCVar5;
    CVar2 = Configuration::configurationType(local_68);
    if (CVar2 == Enabled) {
      Configuration::level(local_68);
      psVar4 = Configuration::value_abi_cxx11_(local_68);
      std::__cxx11::string::string(local_90,(string *)psVar4);
      local_69 = build::anon_class_1_0_00000001::operator()
                           ((anon_class_1_0_00000001 *)
                            CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                            in_stack_fffffffffffffc38);
      setValue<bool>(in_stack_fffffffffffffcc0,(Level)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                     (bool *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                     (map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
                      *)in_stack_fffffffffffffca8,SUB81(in_stack_fffffffffffffca0 >> 0x38,0));
      std::__cxx11::string::~string(local_90);
    }
    else {
      CVar2 = Configuration::configurationType(local_68);
      if (CVar2 == ToFile) {
        Configuration::level(local_68);
        psVar4 = Configuration::value_abi_cxx11_(local_68);
        std::__cxx11::string::string(local_b8,(string *)psVar4);
        local_91 = build::anon_class_1_0_00000001::operator()
                             ((anon_class_1_0_00000001 *)
                              CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                              in_stack_fffffffffffffc38);
        setValue<bool>(in_stack_fffffffffffffcc0,(Level)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                       (bool *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                       (map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
                        *)in_stack_fffffffffffffca8,SUB81(in_stack_fffffffffffffca0 >> 0x38,0));
        std::__cxx11::string::~string(local_b8);
      }
      else {
        CVar2 = Configuration::configurationType(local_68);
        if (CVar2 == ToStandardOutput) {
          in_stack_fffffffffffffcf4 = Configuration::level(local_68);
          in_stack_fffffffffffffce8 = Configuration::value_abi_cxx11_(local_68);
          std::__cxx11::string::string(local_e0,(string *)in_stack_fffffffffffffce8);
          local_b9 = build::anon_class_1_0_00000001::operator()
                               ((anon_class_1_0_00000001 *)
                                CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                                in_stack_fffffffffffffc38);
          in_stack_fffffffffffffce4 = CONCAT13(local_b9,(int3)in_stack_fffffffffffffce4);
          setValue<bool>(in_stack_fffffffffffffcc0,(Level)((ulong)in_stack_fffffffffffffcb8 >> 0x20)
                         ,(bool *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                         (map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
                          *)in_stack_fffffffffffffca8,SUB81(in_stack_fffffffffffffca0 >> 0x38,0));
          std::__cxx11::string::~string(local_e0);
        }
        else {
          CVar2 = Configuration::configurationType(local_68);
          if (CVar2 != Filename) {
            CVar3 = Configuration::configurationType(local_68);
            if (CVar3 == Format) {
              in_stack_fffffffffffffcd8 = Configuration::level(local_68);
              in_stack_fffffffffffffcd4 = Configuration::level(local_68);
              in_stack_fffffffffffffcc8 = Configuration::value_abi_cxx11_(local_68);
              local_1c0 = std::__cxx11::string::begin();
              in_stack_fffffffffffffcc0 =
                   (TypedConfigurations *)Configuration::value_abi_cxx11_(local_68);
              local_1c8 = std::__cxx11::string::end();
              in_stack_fffffffffffffcb8 = &local_1c9;
              std::allocator<char>::allocator();
              std::__cxx11::string::
              string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                        (in_stack_fffffffffffffc50,in_stack_fffffffffffffc60,
                         in_stack_fffffffffffffc58,in_stack_fffffffffffffc48);
              LogFormat::LogFormat
                        (in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,
                         (string_t *)in_stack_fffffffffffffc60._M_current);
              setValue<el::base::LogFormat>
                        (in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,
                         in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                         (bool)in_stack_fffffffffffffe57);
              LogFormat::~LogFormat
                        ((LogFormat *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30))
              ;
              std::__cxx11::string::~string(local_1b8);
              std::allocator<char>::~allocator(&local_1c9);
            }
            else {
              in_stack_fffffffffffffcb4 = Configuration::configurationType(local_68);
              if (in_stack_fffffffffffffcb4 == MillisecondsWidth) {
                in_stack_fffffffffffffca8 = Configuration::value_abi_cxx11_(local_68);
                std::__cxx11::string::string(local_1f8,(string *)in_stack_fffffffffffffca8);
                in_stack_fffffffffffffca0 =
                     getULong((TypedConfigurations *)
                              CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                              (string *)in_stack_fffffffffffffe60);
                SubsecondPrecision::SubsecondPrecision
                          ((SubsecondPrecision *)
                           CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                           (int)((ulong)in_stack_fffffffffffffc28 >> 0x20));
                setValue<el::base::SubsecondPrecision>
                          ((TypedConfigurations *)
                           CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                           (Level)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                           (SubsecondPrecision *)CONCAT44(in_stack_fffffffffffffce4,CVar2),
                           (map<el::Level,_el::base::SubsecondPrecision,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::SubsecondPrecision>_>_>
                            *)CONCAT44(CVar3,in_stack_fffffffffffffcd8),
                           SUB41(in_stack_fffffffffffffcd4 >> 0x18,0));
                std::__cxx11::string::~string(local_1f8);
              }
              else {
                in_stack_fffffffffffffc9c = Configuration::configurationType(local_68);
                if (in_stack_fffffffffffffc9c == PerformanceTracking) {
                  in_stack_fffffffffffffc90 = Configuration::value_abi_cxx11_(local_68);
                  std::__cxx11::string::string(local_220,(string *)in_stack_fffffffffffffc90);
                  local_1f9 = build::anon_class_1_0_00000001::operator()
                                        ((anon_class_1_0_00000001 *)
                                         CONCAT44(in_stack_fffffffffffffc44,
                                                  in_stack_fffffffffffffc40),
                                         in_stack_fffffffffffffc38);
                  in_stack_fffffffffffffc8c = CONCAT13(local_1f9,(int3)in_stack_fffffffffffffc8c);
                  setValue<bool>(in_stack_fffffffffffffcc0,
                                 (Level)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                                 (bool *)CONCAT44(in_stack_fffffffffffffcb4,
                                                  in_stack_fffffffffffffcb0),
                                 (map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
                                  *)in_stack_fffffffffffffca8,
                                 SUB81(in_stack_fffffffffffffca0 >> 0x38,0));
                  std::__cxx11::string::~string(local_220);
                }
                else {
                  in_stack_fffffffffffffc88 = Configuration::configurationType(local_68);
                  if (in_stack_fffffffffffffc88 == MaxLogFileSize) {
                    Configuration::level(local_68);
                    psVar4 = Configuration::value_abi_cxx11_(local_68);
                    std::__cxx11::string::string(local_248,(string *)psVar4);
                    in_stack_fffffffffffffc70 =
                         (LogFormat *)
                         getULong((TypedConfigurations *)
                                  CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                                  (string *)in_stack_fffffffffffffe60);
                    local_228 = in_stack_fffffffffffffc70;
                    setValue<unsigned_long>
                              ((TypedConfigurations *)
                               CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                               (Level)((ulong)in_stack_fffffffffffffcc8 >> 0x20),
                               (unsigned_long *)in_stack_fffffffffffffcc0,
                               (map<el::Level,_unsigned_long,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
                                *)in_stack_fffffffffffffcb8,
                               SUB41(in_stack_fffffffffffffcb4 >> 0x18,0));
                    std::__cxx11::string::~string(local_248);
                    utils::std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>::
                    push_back((vector<el::Configuration_*,_std::allocator<el::Configuration_*>_> *)
                              CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                              (value_type *)in_stack_fffffffffffffc38);
                  }
                  else {
                    in_stack_fffffffffffffc6c = Configuration::configurationType(local_68);
                    if (in_stack_fffffffffffffc6c == 0x100) {
                      Configuration::level(local_68);
                      in_stack_fffffffffffffc60._M_current =
                           (char *)Configuration::value_abi_cxx11_(local_68);
                      std::__cxx11::string::string
                                (local_270,(string *)in_stack_fffffffffffffc60._M_current);
                      in_stack_fffffffffffffc58._M_current =
                           (char *)getULong((TypedConfigurations *)
                                            CONCAT44(in_stack_fffffffffffffe6c,
                                                     in_stack_fffffffffffffe68),
                                            (string *)in_stack_fffffffffffffe60);
                      local_250 = in_stack_fffffffffffffc58._M_current;
                      setValue<unsigned_long>
                                ((TypedConfigurations *)
                                 CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                                 (Level)((ulong)in_stack_fffffffffffffcc8 >> 0x20),
                                 (unsigned_long *)in_stack_fffffffffffffcc0,
                                 (map<el::Level,_unsigned_long,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
                                  *)in_stack_fffffffffffffcb8,
                                 SUB41(in_stack_fffffffffffffcb4 >> 0x18,0));
                      std::__cxx11::string::~string(local_270);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<el::Configuration_*const_*,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
    ::operator++(local_40);
  }
  local_280 = (**(code **)(*local_10 + 0x28))();
  __gnu_cxx::
  __normal_iterator<el::Configuration*const*,std::vector<el::Configuration*,std::allocator<el::Configuration*>>>
  ::__normal_iterator<el::Configuration**>
            ((__normal_iterator<el::Configuration_*const_*,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
              *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
             (__normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
              *)in_stack_fffffffffffffc28);
  while( true ) {
    local_288 = (**(code **)(*local_10 + 0x30))();
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<el::Configuration_*const_*,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                        *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                       (__normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                        *)in_stack_fffffffffffffc28);
    if (!bVar1) break;
    ppCVar5 = __gnu_cxx::
              __normal_iterator<el::Configuration_*const_*,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
              ::operator*(&local_278);
    local_290 = *ppCVar5;
    in_stack_fffffffffffffc44 = Configuration::configurationType(local_290);
    if (in_stack_fffffffffffffc44 == Filename) {
      in_stack_fffffffffffffc40 = Configuration::level(local_290);
      in_stack_fffffffffffffc38 = Configuration::value_abi_cxx11_(local_290);
      insertFile(in_stack_fffffffffffffcc0,(Level)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                 (string *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
    }
    __gnu_cxx::
    __normal_iterator<el::Configuration_*const_*,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
    ::operator++(&local_278);
  }
  local_298._M_current =
       (Configuration **)
       utils::std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>::begin
                 ((vector<el::Configuration_*,_std::allocator<el::Configuration_*>_> *)
                  in_stack_fffffffffffffc28);
  while( true ) {
    local_2a0 = (Configuration **)
                utils::std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>::end
                          ((vector<el::Configuration_*,_std::allocator<el::Configuration_*>_> *)
                           in_stack_fffffffffffffc28);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                        *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                       (__normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                        *)in_stack_fffffffffffffc28);
    if (!bVar1) break;
    ppCVar6 = __gnu_cxx::
              __normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
              ::operator*(&local_298);
    in_stack_fffffffffffffc34 = Configuration::level(*ppCVar6);
    in_stack_fffffffffffffc28 = local_2c0;
    std::function<void(char_const*,unsigned_long)>::
    function<void(&)(char_const*,unsigned_long),void>
              ((function<void_(const_char_*,_unsigned_long)> *)
               CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
               (_func_void_char_ptr_unsigned_long *)in_stack_fffffffffffffc38);
    unsafeValidateFileRolling
              ((TypedConfigurations *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
               (Level)((ulong)in_stack_fffffffffffffc90 >> 0x20),
               (PreRollOutCallback *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    utils::std::function<void_(const_char_*,_unsigned_long)>::~function
              ((function<void_(const_char_*,_unsigned_long)> *)0x26d505);
    __gnu_cxx::
    __normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
    ::operator++(&local_298);
  }
  utils::std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>::~vector
            ((vector<el::Configuration_*,_std::allocator<el::Configuration_*>_> *)
             CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40));
  threading::internal::NoScopedLock<el::base::threading::internal::NoMutex>::~NoScopedLock
            (&local_18);
  return;
}

Assistant:

void TypedConfigurations::build(Configurations* configurations) {
  base::threading::ScopedLock scopedLock(lock());
  auto getBool = [] (std::string boolStr) -> bool {  // Pass by value for trimming
    base::utils::Str::trim(boolStr);
    return (boolStr == "TRUE" || boolStr == "true" || boolStr == "1");
  };
  std::vector<Configuration*> withFileSizeLimit;
  for (Configurations::const_iterator it = configurations->begin(); it != configurations->end(); ++it) {
    Configuration* conf = *it;
    // We cannot use switch on strong enums because Intel C++ dont support them yet
    if (conf->configurationType() == ConfigurationType::Enabled) {
      setValue(conf->level(), getBool(conf->value()), &m_enabledMap);
    } else if (conf->configurationType() == ConfigurationType::ToFile) {
      setValue(conf->level(), getBool(conf->value()), &m_toFileMap);
    } else if (conf->configurationType() == ConfigurationType::ToStandardOutput) {
      setValue(conf->level(), getBool(conf->value()), &m_toStandardOutputMap);
    } else if (conf->configurationType() == ConfigurationType::Filename) {
      // We do not yet configure filename but we will configure in another
      // loop. This is because if file cannot be created, we will force ToFile
      // to be false. Because configuring logger is not necessarily performance
      // sensative operation, we can live with another loop; (by the way this loop
      // is not very heavy either)
    } else if (conf->configurationType() == ConfigurationType::Format) {
      setValue(conf->level(), base::LogFormat(conf->level(),
                                              base::type::string_t(conf->value().begin(), conf->value().end())), &m_logFormatMap);
    } else if (conf->configurationType() == ConfigurationType::SubsecondPrecision) {
      setValue(Level::Global,
               base::SubsecondPrecision(static_cast<int>(getULong(conf->value()))), &m_subsecondPrecisionMap);
    } else if (conf->configurationType() == ConfigurationType::PerformanceTracking) {
      setValue(Level::Global, getBool(conf->value()), &m_performanceTrackingMap);
    } else if (conf->configurationType() == ConfigurationType::MaxLogFileSize) {
      setValue(conf->level(), static_cast<std::size_t>(getULong(conf->value())), &m_maxLogFileSizeMap);
#if !defined(ELPP_NO_DEFAULT_LOG_FILE)
      withFileSizeLimit.push_back(conf);
#endif  // !defined(ELPP_NO_DEFAULT_LOG_FILE)
    } else if (conf->configurationType() == ConfigurationType::LogFlushThreshold) {
      setValue(conf->level(), static_cast<std::size_t>(getULong(conf->value())), &m_logFlushThresholdMap);
    }
  }
  // As mentioned earlier, we will now set filename configuration in separate loop to deal with non-existent files
  for (Configurations::const_iterator it = configurations->begin(); it != configurations->end(); ++it) {
    Configuration* conf = *it;
    if (conf->configurationType() == ConfigurationType::Filename) {
      insertFile(conf->level(), conf->value());
    }
  }
  for (std::vector<Configuration*>::iterator conf = withFileSizeLimit.begin();
       conf != withFileSizeLimit.end(); ++conf) {
    // This is not unsafe as mutex is locked in currect scope
    unsafeValidateFileRolling((*conf)->level(), base::defaultPreRollOutCallback);
  }
}